

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4eaaf::IntrusiveListIteratorTest::
TestBackward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
          (IntrusiveListIteratorTest *this,iterator first,iterator last,
          vector<int,_std::allocator<int>_> *expected)

{
  iterator rhs;
  bool bVar1;
  const_reference lhs;
  pointer pTVar2;
  char *pcVar3;
  AssertHelper local_a0;
  Message local_98;
  size_type local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  unsigned_long local_40;
  size_t count;
  vector<int,_std::allocator<int>_> *expected_local;
  IntrusiveListIteratorTest *this_local;
  iterator last_local;
  iterator first_local;
  
  last_local.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)last.node_;
  this_local = (IntrusiveListIteratorTest *)last.list_;
  last_local.node_ = (TestObject *)first.list_;
  local_40 = 0;
  count = (size_t)expected;
  expected_local = (vector<int,_std::allocator<int>_> *)this;
  while( true ) {
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_local;
    rhs.node_ = (TestObject *)last_local.list_;
    rhs.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)this_local;
    bVar1 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator!=
                      ((iterator *)&last_local.node_,rhs);
    if (!bVar1) {
      local_90 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)count);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_88,"count","expected.size()",&local_40,&local_90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,0xb1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a0,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::Message::~Message(&local_98);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      return;
    }
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator--
              ((iterator *)&this_local);
    lhs = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)count,local_40);
    pTVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator::operator->
                       ((iterator *)&this_local);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_60,"expected[count]","last->data",lhs,&pTVar2->data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                 ,0xae,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message(&local_68);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }